

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCut.c
# Opt level: O0

void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  uint local_38;
  int local_34;
  int Counter;
  int i;
  Abc_Obj_t *pFanC;
  Abc_Obj_t *pFan1;
  Abc_Obj_t *pFan0;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_38 = 0;
  local_34 = 0;
  pObj = (Abc_Obj_t *)pNtk;
  do {
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)(pObj->vFanins).pArray);
    if (iVar2 <= local_34) {
      printf("Substracted %d fanouts\n",(ulong)local_38);
      return;
    }
    pFan0 = Abc_NtkObj((Abc_Ntk_t *)pObj,local_34);
    uVar1 = local_38;
    if ((pFan0 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_NodeIsMuxType(pFan0), iVar2 != 0)) {
      pAVar3 = Abc_NodeRecognizeMux(pFan0,&pFanC,&pFan1);
      pAVar3 = Abc_ObjRegular(pAVar3);
      pFan1 = Abc_ObjRegular(pFan1);
      if ((pAVar3->vFanouts).nSize < 2) {
        __assert_fail("pFanC->vFanouts.nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                      ,0x41,"void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *)");
      }
      (pAVar3->vFanouts).nSize = (pAVar3->vFanouts).nSize + -1;
      iVar2 = Abc_NodeIsExorType(pFan0);
      uVar1 = local_38 + 1;
      if (iVar2 != 0) {
        if ((pFan1->vFanouts).nSize < 2) {
          __assert_fail("pFan0->vFanouts.nSize > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcCut.c"
                        ,0x46,"void Abc_NtkCutsSubtractFanunt(Abc_Ntk_t *)");
        }
        (pFan1->vFanouts).nSize = (pFan1->vFanouts).nSize + -1;
        uVar1 = local_38 + 2;
      }
    }
    local_38 = uVar1;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

void Abc_NtkCutsSubtractFanunt( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pFan0, * pFan1, * pFanC;
    int i, Counter = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( !Abc_NodeIsMuxType(pObj) )
            continue;
        pFanC = Abc_NodeRecognizeMux( pObj, &pFan1, &pFan0 );
        pFanC = Abc_ObjRegular(pFanC);
        pFan0 = Abc_ObjRegular(pFan0);
        assert( pFanC->vFanouts.nSize > 1 );
        pFanC->vFanouts.nSize--;
        Counter++;
        if ( Abc_NodeIsExorType(pObj) )
        {
            assert( pFan0->vFanouts.nSize > 1 );
            pFan0->vFanouts.nSize--;
            Counter++;
        }
    }
    printf("Substracted %d fanouts\n", Counter );
}